

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

string * __thiscall
cmTarget::GetAppBundleDirectory
          (string *__return_storage_ptr__,cmTarget *this,string *config,bool contentOnly)

{
  GetFullName(__return_storage_ptr__,this,config,false);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (!contentOnly) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTarget::GetAppBundleDirectory(const std::string& config,
                                            bool contentOnly) const
{
  std::string fpath = this->GetFullName(config, false);
  fpath += ".app/Contents";
  if(!contentOnly)
    fpath += "/MacOS";
  return fpath;
}